

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctr_drbg.c
# Opt level: O1

void mbedtls_ctr_drbg_free(mbedtls_ctr_drbg_context *ctx)

{
  long lVar1;
  
  if (ctx != (mbedtls_ctr_drbg_context *)0x0) {
    mbedtls_aes_free(&ctx->aes_ctx);
    lVar1 = 0;
    do {
      ctx->counter[lVar1] = '\0';
      lVar1 = lVar1 + 1;
    } while (lVar1 != 0x158);
  }
  return;
}

Assistant:

void mbedtls_ctr_drbg_free( mbedtls_ctr_drbg_context *ctx )
{
    if( ctx == NULL )
        return;

#if defined(MBEDTLS_THREADING_C)
    mbedtls_mutex_free( &ctx->mutex );
#endif
    mbedtls_aes_free( &ctx->aes_ctx );
    mbedtls_zeroize( ctx, sizeof( mbedtls_ctr_drbg_context ) );
}